

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

int32 __thiscall nuraft::raft_server::get_quorum_for_commit(raft_server *this)

{
  int32 iVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  ptr<raft_params> params;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  context::get_params((context *)&local_48);
  iVar1 = get_num_voting_members(this);
  if ((*(char *)(local_48 + 0x51) == '\x01') &&
     (p_Var3 = (this->peers_)._M_h._M_before_begin._M_nxt, p_Var3 != (_Hash_node_base *)0x0)) {
    do {
      iVar2 = 0;
      if (iVar1 != 0) {
        peer::get_snapshot_sync_ctx((peer *)&stack0xffffffffffffffc8);
        iVar2 = -(uint)(local_38 != (element_type *)0x0);
        if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
        }
      }
      iVar1 = iVar1 + iVar2;
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  iVar2 = *(int *)(local_48 + 0x38);
  if ((iVar2 < 1) || (iVar1 < iVar2)) {
    iVar1 = iVar1 / 2;
  }
  else {
    iVar1 = iVar2 + -1;
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return iVar1;
}

Assistant:

int32 raft_server::get_quorum_for_commit() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();

    if (params->exclude_snp_receiver_from_quorum_){
        // If the option is on, exclude any peer who is
        // receiving snapshot.
        for (auto& entry: peers_) {
            ptr<peer>& p = entry.second;
            if ( num_voting_members &&
                 p->get_snapshot_sync_ctx() ) {
                num_voting_members--;
            }
        }
    }

    if ( params->custom_commit_quorum_size_ <= 0 ||
         params->custom_commit_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_commit_quorum_size_ - 1;
}